

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

string * __thiscall
flow::CastInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,CastInstr *this)

{
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  LiteralType local_27c;
  string local_278;
  LiteralType *local_258;
  code *local_250;
  undefined **local_240;
  undefined1 *local_238;
  long local_230;
  ulong local_228;
  undefined1 local_220 [504];
  
  local_27c = (this->super_Instr).super_Value.type_;
  local_258 = &local_27c;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::format_custom_arg<flow::LiteralType>;
  local_230 = 0;
  local_240 = &PTR_grow_001ade08;
  local_228 = 500;
  format_str.size_ = 7;
  format_str.data_ = "cast {}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args.types_ = 0xd;
  local_238 = local_220;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_240,format_str,args);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,local_238,local_238 + local_230);
  local_240 = &PTR_grow_001ade08;
  if (local_238 != local_220) {
    operator_delete(local_238,local_228);
  }
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CastInstr::to_string() const {
  return formatOne(fmt::format("cast {}", type()));
}